

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

void __thiscall
irr::video::CNullDriver::draw2DImageBatch
          (CNullDriver *this,ITexture *texture,array<irr::core::vector2d<int>_> *positions,
          array<irr::core::rect<int>_> *sourceRects,rect<int> *clipRect,SColor color,
          bool useAlphaChannelOfTexture)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  uVar1 = (ulong)((long)(positions->m_data).
                        super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(positions->m_data).
                       super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar2 = (ulong)((long)(sourceRects->m_data).
                        super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(sourceRects->m_data).
                       super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4;
  if ((uint)uVar1 < (uint)uVar2) {
    uVar2 = uVar1;
  }
  lVar3 = 0;
  for (lVar4 = 0; (uVar2 & 0xffffffff) * 0x10 != lVar4; lVar4 = lVar4 + 0x10) {
    (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x30])
              (this,texture,
               (long)&((positions->m_data).
                       super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->X + lVar3,
               (long)&(((sourceRects->m_data).
                        super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->UpperLeftCorner).X + lVar4,
               clipRect,(ulong)color.color,(uint)useAlphaChannelOfTexture);
    lVar3 = lVar3 + 8;
  }
  return;
}

Assistant:

void CNullDriver::draw2DImageBatch(const video::ITexture *texture,
		const core::array<core::position2d<s32>> &positions,
		const core::array<core::rect<s32>> &sourceRects,
		const core::rect<s32> *clipRect,
		SColor color,
		bool useAlphaChannelOfTexture)
{
	const irr::u32 drawCount = core::min_<u32>(positions.size(), sourceRects.size());

	for (u32 i = 0; i < drawCount; ++i) {
		draw2DImage(texture, positions[i], sourceRects[i],
				clipRect, color, useAlphaChannelOfTexture);
	}
}